

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O3

void retro_deinit(void)

{
  if (core_initialized == '\x01') {
    free(out_framebuffer);
    gb_emu_deinit(&gb_emu);
    core_initialized = '\0';
  }
  return;
}

Assistant:

void retro_deinit()
{
   if (!core_initialized)
      return;

   free(out_framebuffer);
   gb_emu_deinit(&gb_emu);

   core_initialized = false;
   return;
}